

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int loadStatTbl(sqlite3 *db,int bStat3,char *zSql1,char *zSql2,char *zDb)

{
  long lVar1;
  sqlite3_stmt *psVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  uchar *puVar7;
  Mem *pMVar8;
  i64 iVar9;
  Index *pIVar10;
  IndexSample *pIVar11;
  Index *pIVar12;
  void *__dest;
  void *__src;
  tRowcnt **pptVar13;
  tRowcnt *ptVar14;
  bool bVar15;
  uint uVar16;
  ulong uVar17;
  void **ppvVar18;
  void **ppvVar19;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_48;
  Index *local_40;
  char *local_38;
  
  local_48 = (sqlite3_stmt *)0x0;
  pcVar6 = sqlite3MPrintf(db,zSql1,zDb);
  iVar4 = 7;
  if (pcVar6 != (char *)0x0) {
    iVar4 = sqlite3LockAndPrepare(db,pcVar6,-1,0,(Vdbe *)0x0,&local_48,(char **)0x0);
    sqlite3DbFreeNN(db,pcVar6);
    psVar2 = local_48;
    if (iVar4 == 0) {
      local_40 = (Index *)zSql2;
      iVar4 = sqlite3_step(local_48);
      local_38 = zDb;
      while (iVar4 == 100) {
        puVar7 = sqlite3_column_text(psVar2,0);
        bVar15 = false;
        if (puVar7 != (uchar *)0x0) {
          pMVar8 = columnMem(psVar2,1);
          iVar9 = sqlite3VdbeIntValue(pMVar8);
          columnMallocFailure(psVar2);
          pIVar10 = findIndexOrPrimaryKey(db,(char *)puVar7,zDb);
          if ((pIVar10 != (Index *)0x0) && (pIVar10->nSample == 0)) {
            uVar3 = 1;
            if (bStat3 == 0) {
              if (((pIVar10->pTable->tabFlags & 0x20) == 0) ||
                 ((*(ushort *)&pIVar10->field_0x63 & 3) != 2)) {
                uVar3 = pIVar10->nColumn;
              }
              else {
                uVar3 = pIVar10->nKeyCol;
              }
            }
            pIVar10->nSampleCol = (uint)uVar3;
            uVar16 = (uint)iVar9;
            pIVar11 = (IndexSample *)
                      sqlite3DbMallocZero(db,(long)(int)((((uint)uVar3 + (uint)uVar3 * 2) * 4 + 0x28
                                                         ) * uVar16 + (uint)uVar3 * 4));
            pIVar10->aSample = pIVar11;
            if (pIVar11 == (IndexSample *)0x0) {
              sqlite3_finalize(psVar2);
              bVar15 = true;
              zDb = local_38;
            }
            else {
              pIVar10->aAvgEq = (tRowcnt *)(pIVar11 + (int)uVar16);
              bVar15 = false;
              zDb = local_38;
              if (0 < (int)uVar16) {
                uVar17 = (ulong)(uVar16 & 0x7fffffff);
                pptVar13 = &pIVar11->anDLt;
                ptVar14 = (tRowcnt *)((long)&pIVar11[(int)uVar16].p + (ulong)((uint)uVar3 * 4));
                lVar1 = (ulong)((uint)uVar3 * 4) * 3;
                ppvVar18 = &pIVar11[(int)uVar16].p;
                ppvVar19 = &pIVar11[(int)uVar16].p + uVar3;
                do {
                  ppvVar18 = (void **)((long)ppvVar18 + lVar1);
                  pptVar13[-2] = ptVar14;
                  pptVar13[-1] = (tRowcnt *)ppvVar19;
                  *pptVar13 = (tRowcnt *)ppvVar18;
                  pptVar13 = pptVar13 + 5;
                  ptVar14 = (tRowcnt *)((long)ptVar14 + lVar1);
                  ppvVar19 = (void **)((long)ppvVar19 + lVar1);
                  uVar17 = uVar17 - 1;
                } while (uVar17 != 0);
              }
            }
          }
        }
        if (bVar15) {
          return 7;
        }
        iVar4 = sqlite3_step(psVar2);
      }
      iVar4 = sqlite3_finalize(psVar2);
      if (iVar4 == 0) {
        pcVar6 = sqlite3MPrintf(db,(char *)local_40,zDb);
        iVar4 = 7;
        if (pcVar6 != (char *)0x0) {
          iVar4 = sqlite3LockAndPrepare(db,pcVar6,-1,0,(Vdbe *)0x0,&local_48,(char **)0x0);
          sqlite3DbFreeNN(db,pcVar6);
          psVar2 = local_48;
          if (iVar4 == 0) {
            iVar4 = sqlite3_step(local_48);
            pIVar10 = (Index *)0x0;
            while (iVar4 == 100) {
              puVar7 = sqlite3_column_text(psVar2,0);
              iVar4 = 7;
              if (((puVar7 != (uchar *)0x0) &&
                  (pIVar12 = findIndexOrPrimaryKey(db,(char *)puVar7,local_38),
                  pIVar12 != (Index *)0x0)) &&
                 ((iVar5 = pIVar12->nSampleCol, bStat3 == 0 || (iVar5 < 2)))) {
                if (pIVar12 != pIVar10) {
                  initAvgEq(pIVar10);
                  pIVar10 = pIVar12;
                }
                local_40 = pIVar10;
                psVar2 = local_48;
                pIVar11 = pIVar12->aSample;
                iVar4 = pIVar12->nSample;
                puVar7 = sqlite3_column_text(local_48,1);
                decodeIntArray((char *)puVar7,iVar5,pIVar11[iVar4].anEq,(LogEst *)0x0,(Index *)0x0);
                puVar7 = sqlite3_column_text(psVar2,2);
                decodeIntArray((char *)puVar7,iVar5,pIVar11[iVar4].anLt,(LogEst *)0x0,(Index *)0x0);
                puVar7 = sqlite3_column_text(psVar2,3);
                decodeIntArray((char *)puVar7,iVar5,pIVar11[iVar4].anDLt,(LogEst *)0x0,(Index *)0x0)
                ;
                iVar5 = sqlite3_column_bytes(psVar2,4);
                pIVar11[iVar4].n = iVar5;
                __dest = sqlite3DbMallocZero(db,(long)(iVar5 + 2));
                pIVar11[iVar4].p = __dest;
                if (__dest == (void *)0x0) {
                  sqlite3_finalize(psVar2);
                  iVar4 = 1;
                  pIVar10 = local_40;
                }
                else {
                  if (pIVar11[iVar4].n != 0) {
                    pMVar8 = columnMem(psVar2,4);
                    __src = sqlite3_value_blob(pMVar8);
                    columnMallocFailure(psVar2);
                    memcpy(__dest,__src,(long)pIVar11[iVar4].n);
                  }
                  pIVar12->nSample = pIVar12->nSample + 1;
                  iVar4 = 0;
                  pIVar10 = local_40;
                }
              }
              psVar2 = local_48;
              if ((iVar4 != 7) && (iVar4 != 0)) {
                return 7;
              }
              iVar4 = sqlite3_step(local_48);
            }
            iVar4 = sqlite3_finalize(psVar2);
            if (iVar4 == 0) {
              initAvgEq(pIVar10);
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int loadStatTbl(
  sqlite3 *db,                  /* Database handle */
  int bStat3,                   /* Assume single column records only */
  const char *zSql1,            /* SQL statement 1 (see above) */
  const char *zSql2,            /* SQL statement 2 (see above) */
  const char *zDb               /* Database name (e.g. "main") */
){
  int rc;                       /* Result codes from subroutines */
  sqlite3_stmt *pStmt = 0;      /* An SQL statement being run */
  char *zSql;                   /* Text of the SQL statement */
  Index *pPrevIdx = 0;          /* Previous index in the loop */
  IndexSample *pSample;         /* A slot in pIdx->aSample[] */

  assert( db->lookaside.bDisable );
  zSql = sqlite3MPrintf(db, zSql1, zDb);
  if( !zSql ){
    return SQLITE_NOMEM_BKPT;
  }
  rc = sqlite3_prepare(db, zSql, -1, &pStmt, 0);
  sqlite3DbFree(db, zSql);
  if( rc ) return rc;

  while( sqlite3_step(pStmt)==SQLITE_ROW ){
    int nIdxCol = 1;              /* Number of columns in stat4 records */

    char *zIndex;   /* Index name */
    Index *pIdx;    /* Pointer to the index object */
    int nSample;    /* Number of samples */
    int nByte;      /* Bytes of space required */
    int i;          /* Bytes of space required */
    tRowcnt *pSpace;

    zIndex = (char *)sqlite3_column_text(pStmt, 0);
    if( zIndex==0 ) continue;
    nSample = sqlite3_column_int(pStmt, 1);
    pIdx = findIndexOrPrimaryKey(db, zIndex, zDb);
    assert( pIdx==0 || bStat3 || pIdx->nSample==0 );
    /* Index.nSample is non-zero at this point if data has already been
    ** loaded from the stat4 table. In this case ignore stat3 data.  */
    if( pIdx==0 || pIdx->nSample ) continue;
    if( bStat3==0 ){
      assert( !HasRowid(pIdx->pTable) || pIdx->nColumn==pIdx->nKeyCol+1 );
      if( !HasRowid(pIdx->pTable) && IsPrimaryKeyIndex(pIdx) ){
        nIdxCol = pIdx->nKeyCol;
      }else{
        nIdxCol = pIdx->nColumn;
      }
    }
    pIdx->nSampleCol = nIdxCol;
    nByte = sizeof(IndexSample) * nSample;
    nByte += sizeof(tRowcnt) * nIdxCol * 3 * nSample;
    nByte += nIdxCol * sizeof(tRowcnt);     /* Space for Index.aAvgEq[] */

    pIdx->aSample = sqlite3DbMallocZero(db, nByte);
    if( pIdx->aSample==0 ){
      sqlite3_finalize(pStmt);
      return SQLITE_NOMEM_BKPT;
    }
    pSpace = (tRowcnt*)&pIdx->aSample[nSample];
    pIdx->aAvgEq = pSpace; pSpace += nIdxCol;
    for(i=0; i<nSample; i++){
      pIdx->aSample[i].anEq = pSpace; pSpace += nIdxCol;
      pIdx->aSample[i].anLt = pSpace; pSpace += nIdxCol;
      pIdx->aSample[i].anDLt = pSpace; pSpace += nIdxCol;
    }
    assert( ((u8*)pSpace)-nByte==(u8*)(pIdx->aSample) );
  }
  rc = sqlite3_finalize(pStmt);
  if( rc ) return rc;

  zSql = sqlite3MPrintf(db, zSql2, zDb);
  if( !zSql ){
    return SQLITE_NOMEM_BKPT;
  }
  rc = sqlite3_prepare(db, zSql, -1, &pStmt, 0);
  sqlite3DbFree(db, zSql);
  if( rc ) return rc;

  while( sqlite3_step(pStmt)==SQLITE_ROW ){
    char *zIndex;                 /* Index name */
    Index *pIdx;                  /* Pointer to the index object */
    int nCol = 1;                 /* Number of columns in index */

    zIndex = (char *)sqlite3_column_text(pStmt, 0);
    if( zIndex==0 ) continue;
    pIdx = findIndexOrPrimaryKey(db, zIndex, zDb);
    if( pIdx==0 ) continue;
    /* This next condition is true if data has already been loaded from 
    ** the sqlite_stat4 table. In this case ignore stat3 data.  */
    nCol = pIdx->nSampleCol;
    if( bStat3 && nCol>1 ) continue;
    if( pIdx!=pPrevIdx ){
      initAvgEq(pPrevIdx);
      pPrevIdx = pIdx;
    }
    pSample = &pIdx->aSample[pIdx->nSample];
    decodeIntArray((char*)sqlite3_column_text(pStmt,1),nCol,pSample->anEq,0,0);
    decodeIntArray((char*)sqlite3_column_text(pStmt,2),nCol,pSample->anLt,0,0);
    decodeIntArray((char*)sqlite3_column_text(pStmt,3),nCol,pSample->anDLt,0,0);

    /* Take a copy of the sample. Add two 0x00 bytes the end of the buffer.
    ** This is in case the sample record is corrupted. In that case, the
    ** sqlite3VdbeRecordCompare() may read up to two varints past the
    ** end of the allocated buffer before it realizes it is dealing with
    ** a corrupt record. Adding the two 0x00 bytes prevents this from causing
    ** a buffer overread.  */
    pSample->n = sqlite3_column_bytes(pStmt, 4);
    pSample->p = sqlite3DbMallocZero(db, pSample->n + 2);
    if( pSample->p==0 ){
      sqlite3_finalize(pStmt);
      return SQLITE_NOMEM_BKPT;
    }
    if( pSample->n ){
      memcpy(pSample->p, sqlite3_column_blob(pStmt, 4), pSample->n);
    }
    pIdx->nSample++;
  }
  rc = sqlite3_finalize(pStmt);
  if( rc==SQLITE_OK ) initAvgEq(pPrevIdx);
  return rc;
}